

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProductsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  BeagleCPUImpl<double,_1,_0> *pBVar7;
  ulong uVar8;
  long lVar9;
  int k;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  pointer pdVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vector<double,_std::allocator<double>_> tmp;
  allocator_type local_99;
  double *local_98;
  BeagleCPUImpl<double,_1,_0> *local_90;
  double *local_88;
  double local_80;
  double *local_78;
  long local_70;
  double *local_68;
  double *local_60;
  ulong local_58;
  value_type_conflict local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  lVar20 = 0;
  local_98 = preOrderPartial;
  local_90 = this;
  local_88 = postOrderPartial;
  local_80 = edgeLength;
  local_78 = outCrossProducts;
  local_68 = categoryRates;
  local_60 = categoryWeights;
  for (lVar17 = 0; lVar17 < this->kPatternCount; lVar17 = lVar17 + 1) {
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,
               (ulong)(uint)(this->kStateCount * this->kStateCount),&local_50,&local_99);
    pBVar7 = local_90;
    lVar12 = (long)this->kPartialsPaddedStateCount;
    iVar5 = this->kPatternCount;
    uVar6 = this->kStateCount;
    auVar21 = ZEXT816(0) << 0x40;
    lVar9 = (long)(int)uVar6;
    local_58 = (ulong)(uint)(~(this->kCategoryCount >> 0x1f) & this->kCategoryCount);
    uVar8 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
    lVar16 = iVar5 * lVar12;
    pdVar15 = (double *)((long)local_88 + lVar20 * lVar12);
    pdVar14 = (double *)(lVar20 * lVar12 + (long)local_98);
    for (uVar18 = 0; uVar18 != local_58; uVar18 = uVar18 + 1) {
      auVar24 = ZEXT816(0) << 0x40;
      dVar1 = local_68[uVar18];
      dVar2 = local_60[uVar18];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar2;
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        auVar26._8_8_ = 0;
        auVar26._0_8_ = pdVar15[uVar10];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pdVar14[uVar10];
        auVar24 = vfmadd231sd_fma(auVar24,auVar26,auVar3);
      }
      lVar19 = 0;
      for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
        for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)((long)local_48._M_impl.super__Vector_impl_data._M_start +
                                   uVar11 * 8 + lVar19);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = dVar1 * local_80;
          auVar27._8_8_ = 0;
          auVar27._0_8_ =
               dVar2 * local_98[(uVar18 * (long)iVar5 + lVar17) * lVar12 + uVar10] * pdVar15[uVar11]
          ;
          auVar23 = vfmadd213sd_fma(auVar27,auVar25,auVar4);
          *(long *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar11 * 8 + lVar19) =
               auVar23._0_8_;
        }
        lVar19 = lVar19 + lVar9 * 8;
      }
      auVar21 = vfmadd231sd_fma(auVar21,auVar24,auVar22);
      pdVar15 = pdVar15 + lVar16;
      pdVar14 = pdVar14 + lVar16;
    }
    auVar21._0_8_ = local_90->gPatternWeights[lVar17] / auVar21._0_8_;
    auVar21._8_8_ = 0;
    pdVar13 = local_48._M_impl.super__Vector_impl_data._M_start;
    pdVar14 = local_78;
    for (uVar18 = 0; uVar18 != uVar8; uVar18 = uVar18 + 1) {
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        auVar23._8_8_ = 0;
        auVar23._0_8_ = pdVar13[uVar10];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = pdVar14[uVar10];
        auVar24 = vfmadd213sd_fma(auVar23,auVar21,auVar24);
        pdVar14[uVar10] = auVar24._0_8_;
      }
      pdVar13 = pdVar13 + lVar9;
      pdVar14 = pdVar14 + lVar9;
    }
    local_70 = lVar20;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    lVar20 = lVar20 + 8;
    this = pBVar7;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                  const REALTYPE *preOrderPartial,
                                                                  const double *categoryRates,
                                                                  const REALTYPE *categoryWeights,
                                                                  const double edgeLength,
                                                                  double *outCrossProducts,
                                                                  double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE denominator = 0.0;
            for (int k = 0; k < kStateCount; k++) {
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }
            patternDenominator += denominator * weight;

            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    tmp[k * kStateCount + j] += preOrderPartial[v + k] * postOrderPartial[v + j] * weight * scale;
                }
            }
        }

        const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < kStateCount; k++) {
            for (int j = 0; j < kStateCount; j++) {
                outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
            }
        }
    }
}